

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreFactory.cpp
# Opt level: O3

void helics::CoreFactory::unregisterCore(string_view name)

{
  bool bVar1;
  long in_RSI;
  long in_RDI;
  string local_60;
  undefined1 local_40 [16];
  _Any_data local_30;
  code *local_20;
  code *local_18;
  
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,in_RSI,in_RDI + in_RSI);
  bVar1 = gmlc::concurrency::SearchableObjectHolder<helics::Core,_helics::CoreType>::removeObject
                    ((SearchableObjectHolder<helics::Core,_helics::CoreType> *)searchableCores,
                     &local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  if (!bVar1) {
    local_30._8_8_ = 0;
    local_30._M_unused._M_object = local_40;
    local_18 = std::
               _Function_handler<bool_(const_std::shared_ptr<helics::Core>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/CoreFactory.cpp:413:38)>
               ::_M_invoke;
    local_20 = std::
               _Function_handler<bool_(const_std::shared_ptr<helics::Core>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/CoreFactory.cpp:413:38)>
               ::_M_manager;
    gmlc::concurrency::SearchableObjectHolder<helics::Core,_helics::CoreType>::removeObject
              ((SearchableObjectHolder<helics::Core,_helics::CoreType> *)searchableCores,
               (function<bool_(const_std::shared_ptr<helics::Core>_&)> *)&local_30);
    if (local_20 != (code *)0x0) {
      (*local_20)((_Any_data *)&local_30,(_Any_data *)&local_30,__destroy_functor);
    }
  }
  return;
}

Assistant:

void unregisterCore(std::string_view name)
{
    if (!searchableCores.removeObject(std::string{name})) {
        searchableCores.removeObject([&name](auto& obj) { return (obj->getIdentifier() == name); });
    }
}